

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

int __thiscall QLocale::toInt(QLocale *this,QStringView s,bool *ok)

{
  long lVar1;
  QStringView str;
  int iVar2;
  bool *in_RCX;
  QLocalePrivate *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::QSharedDataPointer::operator_cast_to_QLocalePrivate_
            ((QSharedDataPointer<QLocalePrivate> *)0x4cba04);
  str.m_data = (storage_type_conflict *)this;
  str.m_size = (qsizetype)ok;
  iVar2 = toIntegral_helper<int>(in_RDI,str,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QLocale::toInt(QStringView s, bool *ok) const
{
    return toIntegral_helper<int>(d, s, ok);
}